

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inheritance.hpp
# Opt level: O2

void boost::python::objects::register_conversion<SpikesConsumer,SpikesConsumer_python>
               (bool is_downcast,SpikesConsumer *param_2,SpikesConsumer_python *param_3)

{
  add_cast((type_info)0x3a37b2,(type_info)"21SpikesConsumer_python",
           dynamic_cast_generator<SpikesConsumer,_SpikesConsumer_python>::execute,is_downcast);
  return;
}

Assistant:

inline void register_conversion(
    bool is_downcast = ::boost::is_base_and_derived<Source,Target>::value
    // These parameters shouldn't be used; they're an MSVC bug workaround
    , Source* = 0, Target* = 0)
{
    typedef typename cast_generator<Source,Target>::type generator;

    add_cast(
        python::type_id<Source>()
      , python::type_id<Target>()
      , &generator::execute
      , is_downcast
    );
}